

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubTransport_AMQP_Common_GetTwinAsync
          (IOTHUB_DEVICE_HANDLE handle,IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK completionCallback,
          void *callbackContext)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  undefined8 *context;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  AMQP_TRANSPORT_GET_TWIN_CONTEXT *getTwinCtx;
  LOGGER_LOG l_1;
  AMQP_TRANSPORT_DEVICE_INSTANCE *registered_device;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  void *callbackContext_local;
  IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK completionCallback_local;
  IOTHUB_DEVICE_HANDLE handle_local;
  
  if ((handle == (IOTHUB_DEVICE_HANDLE)0x0) ||
     (completionCallback == (IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                ,"IoTHubTransport_AMQP_Common_GetTwinAsync",0x684,1,
                "Invalid argument (handle=%p, completionCallback=%p)",handle,completionCallback);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    sVar3 = get_number_of_registered_devices(*(AMQP_TRANSPORT_INSTANCE **)((long)handle + 0x10));
    if (sVar3 == 1) {
      context = (undefined8 *)malloc(0x10);
      if (context == (undefined8 *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                    ,"IoTHubTransport_AMQP_Common_GetTwinAsync",0x696,1,
                    "Failed creating context for get twin");
        }
        l._4_4_ = IOTHUB_CLIENT_ERROR;
      }
      else {
        *context = completionCallback;
        context[1] = callbackContext;
        iVar1 = amqp_device_get_twin_async
                          (*(AMQP_DEVICE_HANDLE *)((long)handle + 8),
                           on_device_get_twin_completed_callback,context);
        if (iVar1 == 0) {
          l._4_4_ = IOTHUB_CLIENT_OK;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                      ,"IoTHubTransport_AMQP_Common_GetTwinAsync",0x6a0,1,
                      "Failed subscribing for device Twin updates");
          }
          free(context);
          l._4_4_ = IOTHUB_CLIENT_ERROR;
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                  ,"IoTHubTransport_AMQP_Common_GetTwinAsync",0x68d,1,
                  "Device Twin not supported on device multiplexing scenario");
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_AMQP_Common_GetTwinAsync(IOTHUB_DEVICE_HANDLE handle, IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK completionCallback, void* callbackContext)
{
    (void)callbackContext;

    IOTHUB_CLIENT_RESULT result;

    if (handle == NULL || completionCallback == NULL)
    {
        LogError("Invalid argument (handle=%p, completionCallback=%p)", handle, completionCallback);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE*)handle;

        if (get_number_of_registered_devices(registered_device->transport_instance) != 1)
        {
            LogError("Device Twin not supported on device multiplexing scenario");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            AMQP_TRANSPORT_GET_TWIN_CONTEXT* getTwinCtx;

            if ((getTwinCtx = malloc(sizeof(AMQP_TRANSPORT_GET_TWIN_CONTEXT))) == NULL)
            {
                LogError("Failed creating context for get twin");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                getTwinCtx->on_get_twin_completed_callback = completionCallback;
                getTwinCtx->user_context = callbackContext;

                if (amqp_device_get_twin_async(registered_device->device_handle, on_device_get_twin_completed_callback, (void*)getTwinCtx) != RESULT_OK)
                {
                    LogError("Failed subscribing for device Twin updates");
                    free(getTwinCtx);
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
    }

    return result;
}